

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::MemoryDataParameter::Clear(MemoryDataParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    this->batch_size_ = 0;
    this->channels_ = 0;
    this->height_ = 0;
    this->width_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void MemoryDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.MemoryDataParameter)
  if (_has_bits_[0 / 32] & 15u) {
    ::memset(&batch_size_, 0, reinterpret_cast<char*>(&width_) -
      reinterpret_cast<char*>(&batch_size_) + sizeof(width_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}